

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousehandler.cpp
# Opt level: O2

void __thiscall QEvdevMouseHandler::~QEvdevMouseHandler(QEvdevMouseHandler *this)

{
  *(undefined ***)this = &PTR_metaObject_00150a88;
  if (-1 < *(int *)(this + 0x28)) {
    qt_safe_close(*(int *)(this + 0x28));
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(this + 0x10));
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QEvdevMouseHandler::~QEvdevMouseHandler()
{
    if (m_fd >= 0)
        qt_safe_close(m_fd);
}